

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTableModel.cpp
# Opt level: O3

void __thiscall BaseTableModel::reload(BaseTableModel *this)

{
  int iVar1;
  char *__s;
  bool bVar2;
  undefined8 *puVar3;
  storage_type *psVar4;
  storage_type *psVar5;
  QByteArrayView QVar6;
  int local_4c;
  QString local_48;
  
  QAbstractItemModel::beginResetModel();
  std::vector<std::pair<int,_QString>,_std::allocator<std::pair<int,_QString>_>_>::_M_erase_at_end
            (&this->mItems,
             (this->mItems).
             super__Vector_base<std::pair<int,_QString>,_std::allocator<std::pair<int,_QString>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  local_4c = 0;
  do {
    puVar3 = (undefined8 *)(**(code **)(*(long *)this + 0x198))(this,local_4c);
    if (puVar3 != (undefined8 *)0x0) {
      __s = (char *)*puVar3;
      psVar5 = (storage_type *)(long)*(int *)(puVar3 + 1);
      psVar4 = psVar5;
      if ((long)psVar5 < 1) {
        psVar4 = (storage_type *)0x0;
      }
      if (__s == (char *)0x0) {
        psVar4 = (storage_type *)0x0;
      }
      if (__s != (char *)0x0 && (long)psVar5 < 0) {
        psVar4 = (storage_type *)strlen(__s);
      }
      QVar6.m_data = psVar4;
      QVar6.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar6);
      std::vector<std::pair<int,QString>,std::allocator<std::pair<int,QString>>>::
      emplace_back<int&,QString>
                ((vector<std::pair<int,QString>,std::allocator<std::pair<int,QString>>> *)
                 &this->mItems,&local_4c,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
        }
      }
    }
    iVar1 = local_4c + 1;
    bVar2 = local_4c < 0x3f;
    local_4c = iVar1;
  } while (bVar2);
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void BaseTableModel::reload() {
    beginResetModel();

    mItems.clear();
    for (int id = 0; id < (int)trackerboy::InstrumentTable::MAX_SIZE; ++id) {
        auto str = sourceName(id);
        if (str) {
            mItems.emplace_back(id, QString::fromStdString(*str));
        }
    }

    endResetModel();
}